

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O0

string * duckdb::StringValue::Get_abi_cxx11_(Value *value)

{
  InternalException *this;
  StringValueInfo *this_00;
  string *psVar1;
  long in_RDI;
  string *in_stack_ffffffffffffffa8;
  shared_ptr<duckdb::ExtraValueInfo,_true> *in_stack_ffffffffffffffb0;
  allocator local_29;
  string local_28 [24];
  ExtraValueInfo *in_stack_fffffffffffffff0;
  
  if ((*(byte *)(in_RDI + 0x18) & 1) != 0) {
    this = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_28,"Calling StringValue::Get on a NULL value",&local_29);
    InternalException::InternalException(this,in_stack_ffffffffffffffa8);
    __cxa_throw(this,&InternalException::typeinfo,InternalException::~InternalException);
  }
  shared_ptr<duckdb::ExtraValueInfo,_true>::operator->(in_stack_ffffffffffffffb0);
  this_00 = ExtraValueInfo::Get<duckdb::StringValueInfo>(in_stack_fffffffffffffff0);
  psVar1 = StringValueInfo::GetString_abi_cxx11_(this_00);
  return psVar1;
}

Assistant:

const string &StringValue::Get(const Value &value) {
	if (value.is_null) {
		throw InternalException("Calling StringValue::Get on a NULL value");
	}
	D_ASSERT(value.type().InternalType() == PhysicalType::VARCHAR);
	D_ASSERT(value.value_info_);
	return value.value_info_->Get<StringValueInfo>().GetString();
}